

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O1

void __thiscall HeapProfileTable::MarkAsIgnored(HeapProfileTable *this,void *ptr)

{
  long *plVar1;
  long *plVar2;
  
  plVar1 = (long *)((ulong)((uint)((int)((ulong)ptr >> 0x14) * -0x61c88647) >> 0x11 & 0xfffffff8) +
                   (long)this->address_map_->hashtable_);
  do {
    plVar1 = (long *)*plVar1;
    if (plVar1 == (long *)0x0) {
      plVar1 = (long *)0x0;
      break;
    }
  } while (plVar1[1] != (ulong)ptr >> 0x14);
  if (plVar1 != (long *)0x0) {
    plVar2 = (long *)((ulong)((uint)((ulong)ptr >> 4) & 0xfff8) + (long)plVar1 + 0x10);
    do {
      plVar2 = (long *)*plVar2;
      if (plVar2 == (long *)0x0) goto LAB_0011d0a5;
    } while ((void *)plVar2[1] != ptr);
    plVar1 = plVar2 + 2;
LAB_0011d0a5:
    if (plVar2 != (long *)0x0) goto LAB_0011d0ac;
  }
  plVar1 = (long *)0x0;
LAB_0011d0ac:
  if (plVar1 != (long *)0x0) {
    *(byte *)((long)plVar1 + 8) = *(byte *)((long)plVar1 + 8) | 2;
  }
  return;
}

Assistant:

void HeapProfileTable::MarkAsIgnored(const void* ptr) {
  AllocValue* alloc = address_map_->FindMutable(ptr);
  if (alloc) {
    alloc->set_ignore(true);
  }
}